

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::find_content_type
                   (string *path,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *user_data,string *default_content_type)

{
  bool bVar1;
  uint uVar2;
  string *in_RCX;
  string *in_RDI;
  const_iterator it;
  string ext;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  allocator<char> *in_stack_fffffffffffffe30;
  allocator<char> *paVar3;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_stack_fffffffffffffe48;
  allocator<char> local_90;
  allocator<char> local_8f;
  allocator<char> local_8e;
  allocator<char> local_8d;
  allocator<char> local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  allocator<char> local_88;
  undefined1 local_87 [2];
  allocator<char> local_85;
  allocator<char> local_84;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  allocator<char> local_80;
  allocator<char> local_7f;
  allocator<char> local_7e;
  allocator<char> local_7d;
  allocator<char> local_7c;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  allocator<char> local_78;
  allocator<char> local_77;
  allocator<char> local_76;
  allocator<char> local_75;
  allocator<char> local_74;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  allocator<char> local_70;
  allocator<char> local_6f;
  allocator<char> local_6e;
  allocator<char> local_6d;
  allocator<char> local_6c;
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  undefined4 local_68;
  allocator<char> local_61;
  _Self local_60 [3];
  _Self local_48;
  string local_40 [32];
  string *local_20;
  
  local_20 = in_RCX;
  file_extension(in_stack_fffffffffffffe48);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffdf8,(key_type *)0x1c056c);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffdf8);
  bVar1 = std::operator!=(&local_48,local_60);
  if (bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1c05c6);
    std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(&local_61);
    goto LAB_001c1c1f;
  }
  uVar2 = str2tag(in_stack_fffffffffffffe00);
  if (uVar2 == 0x76d) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(&local_85);
    goto LAB_001c1c1f;
  }
  if (uVar2 == 0xd3d) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(&local_8e);
    goto LAB_001c1c1f;
  }
  if (uVar2 != 0xdd9) {
    if (uVar2 == 0x1a2c3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator(&local_69);
      goto LAB_001c1c1f;
    }
    if (uVar2 == 0x1a2c6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator(&local_6a);
      goto LAB_001c1c1f;
    }
    if (uVar2 == 0x1a6df) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator(&local_71);
      goto LAB_001c1c1f;
    }
    if (uVar2 == 0x1b0f1) {
LAB_001c0b03:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator(&local_6b);
      goto LAB_001c1c1f;
    }
    if (uVar2 == 0x1b288) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator(&local_72);
      goto LAB_001c1c1f;
    }
    if (uVar2 == 0x1c97d) {
LAB_001c1177:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator(&local_79);
      goto LAB_001c1c1f;
    }
    if (uVar2 == 0x1cb45) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator(&local_76);
      goto LAB_001c1c1f;
    }
    if (uVar2 == 0x1d0f2) {
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_87;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator((allocator<char> *)local_87);
      goto LAB_001c1c1f;
    }
    if (uVar2 == 0x1d1b9) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator(&local_73);
      goto LAB_001c1c1f;
    }
    if (uVar2 == 0x1d5fd) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator(&local_81);
      goto LAB_001c1c1f;
    }
    if (uVar2 != 0x1db34) {
      if (uVar2 == 0x1de29) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::allocator<char>::~allocator(&local_7a);
        goto LAB_001c1c1f;
      }
      if (uVar2 == 0x1de2e) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::allocator<char>::~allocator(&local_7d);
        goto LAB_001c1c1f;
      }
      if (uVar2 == 0x1dee6) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::allocator<char>::~allocator(&local_82);
        goto LAB_001c1c1f;
      }
      if (uVar2 == 0x1e078) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::allocator<char>::~allocator(&local_6d);
        goto LAB_001c1c1f;
      }
      if (uVar2 == 0x1e147) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::allocator<char>::~allocator(&local_8a);
        goto LAB_001c1c1f;
      }
      if (uVar2 == 0x1e25b) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::allocator<char>::~allocator(&local_77);
        goto LAB_001c1c1f;
      }
      if (uVar2 == 0x1e322) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::allocator<char>::~allocator(&local_74);
        goto LAB_001c1c1f;
      }
      if (uVar2 == 0x1e692) {
        paVar3 = &local_89;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,paVar3);
        std::allocator<char>::~allocator(&local_89);
        goto LAB_001c1c1f;
      }
      if (uVar2 != 0x1f164) {
        if (uVar2 == 0x1f1d9) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_8d);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x1f580) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_80);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x1f7f6) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_6e);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x20a43) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_8f);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x371b38) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_6f);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x372318) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_70);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x372b57) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator((allocator<char> *)(local_87 + 1));
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x37cf7d) goto LAB_001c0b03;
        if (uVar2 == 0x3adb38) {
          paVar3 = &local_88;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,(char *)paVar3,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_88);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x3af938) goto LAB_001c1177;
        if (uVar2 == 0x3dad1f) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_7b);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x3daddb) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_7e);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x3e2ddd) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_78);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x3ff093) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_8c);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x409760) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_75);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x409771) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_7f);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x40977d) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_7c);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x40a648) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_90);
          goto LAB_001c1c1f;
        }
        if (uVar2 == 0x40c278) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          std::allocator<char>::~allocator(&local_83);
          goto LAB_001c1c1f;
        }
        if (uVar2 != 0x43cec5) {
          if (uVar2 == 0x59114a) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
                      );
            std::allocator<char>::~allocator(&local_84);
          }
          else {
            std::__cxx11::string::string((string *)in_RDI,local_20);
          }
          goto LAB_001c1c1f;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::allocator<char>::~allocator(&local_8b);
      goto LAB_001c1c1f;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::allocator<char>::~allocator(&local_6c);
LAB_001c1c1f:
  local_68 = 1;
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

inline std::string
find_content_type(const std::string &path,
                  const std::map<std::string, std::string> &user_data,
                  const std::string &default_content_type) {
  auto ext = file_extension(path);

  auto it = user_data.find(ext);
  if (it != user_data.end()) { return it->second.c_str(); }

  using udl::operator""_t;

  switch (str2tag(ext)) {
  default: return default_content_type;

  case "css"_t: return "text/css";
  case "csv"_t: return "text/csv";
  case "htm"_t:
  case "html"_t: return "text/html";
  case "js"_t:
  case "mjs"_t: return "text/javascript";
  case "txt"_t: return "text/plain";
  case "vtt"_t: return "text/vtt";

  case "apng"_t: return "image/apng";
  case "avif"_t: return "image/avif";
  case "bmp"_t: return "image/bmp";
  case "gif"_t: return "image/gif";
  case "png"_t: return "image/png";
  case "svg"_t: return "image/svg+xml";
  case "webp"_t: return "image/webp";
  case "ico"_t: return "image/x-icon";
  case "tif"_t: return "image/tiff";
  case "tiff"_t: return "image/tiff";
  case "jpg"_t:
  case "jpeg"_t: return "image/jpeg";

  case "mp4"_t: return "video/mp4";
  case "mpeg"_t: return "video/mpeg";
  case "webm"_t: return "video/webm";

  case "mp3"_t: return "audio/mp3";
  case "mpga"_t: return "audio/mpeg";
  case "weba"_t: return "audio/webm";
  case "wav"_t: return "audio/wave";

  case "otf"_t: return "font/otf";
  case "ttf"_t: return "font/ttf";
  case "woff"_t: return "font/woff";
  case "woff2"_t: return "font/woff2";

  case "7z"_t: return "application/x-7z-compressed";
  case "atom"_t: return "application/atom+xml";
  case "pdf"_t: return "application/pdf";
  case "json"_t: return "application/json";
  case "rss"_t: return "application/rss+xml";
  case "tar"_t: return "application/x-tar";
  case "xht"_t:
  case "xhtml"_t: return "application/xhtml+xml";
  case "xslt"_t: return "application/xslt+xml";
  case "xml"_t: return "application/xml";
  case "gz"_t: return "application/gzip";
  case "zip"_t: return "application/zip";
  case "wasm"_t: return "application/wasm";
  }
}